

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_recoverable_signature_convert
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,
              secp256k1_ecdsa_recoverable_signature *sigin)

{
  uint uVar1;
  undefined8 in_RAX;
  long lVar2;
  uint uVar3;
  secp256k1_scalar *psVar4;
  uint local_18;
  uint local_14;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_recoverable_signature_convert_cold_3();
  }
  else if (sig != (secp256k1_ecdsa_signature *)0x0) {
    if (sigin == (secp256k1_ecdsa_recoverable_signature *)0x0) {
      secp256k1_ecdsa_recoverable_signature_convert_cold_1();
      return 0;
    }
    lVar2 = 0;
    psVar4 = (secp256k1_scalar *)0x0;
    do {
      uVar3 = (uint)sigin->data[lVar2] | (int)psVar4 << 8;
      uVar1 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uVar1 = uVar3;
      }
      psVar4 = (secp256k1_scalar *)(ulong)uVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    _local_18 = CONCAT44((uint)((ulong)in_RAX >> 0x20),uVar1);
    secp256k1_scalar_verify(psVar4);
    lVar2 = 0;
    psVar4 = (secp256k1_scalar *)0x0;
    do {
      uVar3 = (uint)sigin->data[lVar2 + 0x20] | (int)psVar4 << 8;
      uVar1 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uVar1 = uVar3;
      }
      psVar4 = (secp256k1_scalar *)(ulong)uVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    _local_18 = CONCAT44(uVar1,local_18);
    secp256k1_scalar_verify(psVar4);
    secp256k1_ecdsa_signature_save(sig,&local_18,&local_14);
    return 1;
  }
  secp256k1_ecdsa_recoverable_signature_convert_cold_2();
  return 0;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_convert(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const secp256k1_ecdsa_recoverable_signature* sigin) {
    secp256k1_scalar r, s;
    int recid;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, sigin);
    secp256k1_ecdsa_signature_save(sig, &r, &s);
    return 1;
}